

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

int32 rw::wdgl::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) == 0) || (**(int **)((long)object + 0x98) != 0xb)) {
    object_local._4_4_ = 0;
  }
  else {
    object_local._4_4_ =
         *(int *)(*(long *)((long)object + 0x98) + 4) * 0x18 + 4 +
         *(int *)(*(long *)((long)object + 0x98) + 0x10);
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	return 4 + header->numAttribs*sizeof(AttribDesc) + header->dataSize;
}